

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult vmaAllocateMemoryForImage
                   (VmaAllocator allocator,VkImage image,VmaAllocationCreateInfo *pCreateInfo,
                   VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VkResult VVar1;
  bool prefersDedicatedAllocation;
  bool requiresDedicatedAllocation;
  VmaAllocationCreateInfo *local_58;
  VmaAllocationInfo *local_50;
  VkMemoryRequirements vkMemReq;
  
  vkMemReq.size = 0;
  vkMemReq.alignment = 0;
  vkMemReq.memoryTypeBits = 0;
  vkMemReq._20_4_ = 0;
  requiresDedicatedAllocation = false;
  prefersDedicatedAllocation = false;
  local_58 = pCreateInfo;
  local_50 = pAllocationInfo;
  VmaAllocator_T::GetImageMemoryRequirements
            (allocator,image,&vkMemReq,&requiresDedicatedAllocation,&prefersDedicatedAllocation);
  VVar1 = VmaAllocator_T::AllocateMemory
                    (allocator,&vkMemReq,requiresDedicatedAllocation,prefersDedicatedAllocation,
                     (VkBuffer)0x0,image,0xffffffff,local_58,VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN,1,
                     pAllocation);
  if ((local_50 != (VmaAllocationInfo *)0x0) && (VVar1 == VK_SUCCESS)) {
    VmaAllocator_T::GetAllocationInfo(allocator,*pAllocation,local_50);
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemoryForImage(
    VmaAllocator allocator,
    VkImage image,
    const VmaAllocationCreateInfo* pCreateInfo,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && image != VK_NULL_HANDLE && pCreateInfo && pAllocation);

    VMA_DEBUG_LOG("vmaAllocateMemoryForImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkMemoryRequirements vkMemReq = {};
    bool requiresDedicatedAllocation = false;
    bool prefersDedicatedAllocation  = false;
    allocator->GetImageMemoryRequirements(image, vkMemReq,
        requiresDedicatedAllocation, prefersDedicatedAllocation);

    VkResult result = allocator->AllocateMemory(
        vkMemReq,
        requiresDedicatedAllocation,
        prefersDedicatedAllocation,
        VK_NULL_HANDLE, // dedicatedBuffer
        image, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_IMAGE_UNKNOWN,
        1, // allocationCount
        pAllocation);

    if(pAllocationInfo && result == VK_SUCCESS)
    {
        allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
    }

    return result;
}